

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O2

bool google::sparsehash_internal::read_bigendian_number<_IO_FILE,unsigned_long>
               (_IO_FILE *fp,unsigned_long *value,size_t length)

{
  bool bVar1;
  ulong in_RAX;
  long lVar2;
  ulong uVar3;
  ulong uStack_38;
  uchar byte;
  
  *value = 0;
  lVar2 = length * 8;
  uStack_38 = in_RAX;
  for (uVar3 = 0; lVar2 = lVar2 + -8, length != uVar3; uVar3 = uVar3 + 1) {
    bVar1 = read_data<_IO_FILE>(fp,&byte,1);
    if (!bVar1) break;
    *value = *value | (uStack_38 >> 0x38) << ((byte)lVar2 & 0x3f);
  }
  return length <= uVar3;
}

Assistant:

bool read_bigendian_number(INPUT* fp, IntType* value, size_t length) {
  *value = 0;
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    if (!read_data(fp, &byte, sizeof(byte))) return false;
    *value |= static_cast<IntType>(byte) << ((length - 1 - i) * 8);
  }
  return true;
}